

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O1

vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *
tinyusdz::lerp<tinyusdz::value::texcoord3f>
          (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *a,
          vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *b,
          double t)

{
  float fVar1;
  float fVar2;
  pointer ptVar3;
  pointer ptVar4;
  pointer ptVar5;
  ulong uVar6;
  long lVar7;
  ulong __new_size;
  float fVar8;
  float fVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = ((long)(a->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(a->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  __new_size = ((long)(b->
                      super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(b->
                      super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar6 <= __new_size) {
    __new_size = uVar6;
  }
  if (__new_size != 0) {
    std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      fVar8 = (float)(1.0 - t);
      fVar9 = (float)t;
      lVar7 = 8;
      do {
        ptVar3 = (a->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ptVar4 = (b->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        fVar1 = *(float *)((long)&ptVar3->s + lVar7);
        fVar2 = *(float *)((long)&ptVar4->s + lVar7);
        ptVar5 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((long)ptVar5 + lVar7 + -8) =
             CONCAT44(*(float *)((long)ptVar4 + lVar7 + -4) * fVar9 +
                      *(float *)((long)ptVar3 + lVar7 + -4) * fVar8,
                      *(float *)((long)ptVar4 + lVar7 + -8) * fVar9 +
                      *(float *)((long)ptVar3 + lVar7 + -8) * fVar8);
        *(float *)((long)&ptVar5->s + lVar7) = fVar2 * fVar9 + fVar1 * fVar8;
        lVar7 = lVar7 + 0xc;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}